

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_utils.c
# Opt level: O2

WEBP_FILTER_TYPE WebPEstimateBestFilter(uint8_t *data,int width,int height,int stride)

{
  uint uVar1;
  byte bVar2;
  ulong uVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  uint8_t *puVar15;
  uint uVar16;
  int (*paiVar17) [16];
  int iVar18;
  int bins [4] [16];
  
  memset(bins,0,0x100);
  lVar7 = (long)stride;
  puVar15 = data + lVar7 * 2;
  for (lVar6 = 2; lVar6 < height + -1; lVar6 = lVar6 + 2) {
    uVar16 = (uint)data[lVar6 * lVar7];
    for (lVar10 = 2; lVar10 < width + -1; lVar10 = lVar10 + 2) {
      uVar13 = (uint)puVar15[lVar10];
      uVar5 = uVar13 - uVar16;
      uVar1 = -uVar5;
      if (0 < (int)uVar5) {
        uVar1 = uVar5;
      }
      iVar18 = uVar13 - puVar15[lVar10 + -1];
      bVar2 = (byte)iVar18;
      bVar4 = -bVar2;
      if (0 < iVar18) {
        bVar4 = bVar2;
      }
      uVar9 = (uint)puVar15[lVar10] - (uint)puVar15[lVar10 - width];
      uVar5 = -uVar9;
      if (0 < (int)uVar9) {
        uVar5 = uVar9;
      }
      iVar18 = ((uint)puVar15[lVar10 - width] + (uint)puVar15[lVar10 + -1]) -
               (uint)puVar15[lVar10 + (-1 - (long)width)];
      if (iVar18 < 1) {
        iVar18 = 0;
      }
      if (0xfe < iVar18) {
        iVar18 = 0xff;
      }
      uVar11 = uVar13 - iVar18;
      uVar9 = -uVar11;
      if (0 < (int)uVar11) {
        uVar9 = uVar11;
      }
      bins[0][uVar1 >> 4] = 1;
      *(undefined4 *)((long)bins[1] + (ulong)(bVar4 >> 2 & 0x3c)) = 1;
      *(undefined4 *)((long)bins[2] + (ulong)(uVar5 >> 2 & 0x3c)) = 1;
      bins[3][uVar9 >> 4] = 1;
      uVar16 = uVar16 * 3 + uVar13 + 2 >> 2;
    }
    puVar15 = puVar15 + lVar7 * 2;
  }
  iVar18 = 0x7fffffff;
  uVar3 = 0;
  paiVar17 = bins;
  for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
    iVar12 = 0;
    for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
      iVar14 = 0;
      if (0 < (*paiVar17)[lVar6]) {
        iVar14 = (int)lVar6;
      }
      iVar12 = iVar12 + iVar14;
    }
    if (iVar12 < iVar18) {
      uVar3 = uVar8 & 0xffffffff;
      iVar18 = iVar12;
    }
    paiVar17 = paiVar17 + 1;
  }
  return (WEBP_FILTER_TYPE)uVar3;
}

Assistant:

WEBP_FILTER_TYPE WebPEstimateBestFilter(const uint8_t* data,
                                        int width, int height, int stride) {
  int i, j;
  int bins[WEBP_FILTER_LAST][SMAX];
  memset(bins, 0, sizeof(bins));

  // We only sample every other pixels. That's enough.
  for (j = 2; j < height - 1; j += 2) {
    const uint8_t* const p = data + j * stride;
    int mean = p[0];
    for (i = 2; i < width - 1; i += 2) {
      const int diff0 = SDIFF(p[i], mean);
      const int diff1 = SDIFF(p[i], p[i - 1]);
      const int diff2 = SDIFF(p[i], p[i - width]);
      const int grad_pred =
          GradientPredictor(p[i - 1], p[i - width], p[i - width - 1]);
      const int diff3 = SDIFF(p[i], grad_pred);
      bins[WEBP_FILTER_NONE][diff0] = 1;
      bins[WEBP_FILTER_HORIZONTAL][diff1] = 1;
      bins[WEBP_FILTER_VERTICAL][diff2] = 1;
      bins[WEBP_FILTER_GRADIENT][diff3] = 1;
      mean = (3 * mean + p[i] + 2) >> 2;
    }
  }
  {
    int filter;
    WEBP_FILTER_TYPE best_filter = WEBP_FILTER_NONE;
    int best_score = 0x7fffffff;
    for (filter = WEBP_FILTER_NONE; filter < WEBP_FILTER_LAST; ++filter) {
      int score = 0;
      for (i = 0; i < SMAX; ++i) {
        if (bins[filter][i] > 0) {
          score += i;
        }
      }
      if (score < best_score) {
        best_score = score;
        best_filter = (WEBP_FILTER_TYPE)filter;
      }
    }
    return best_filter;
  }
}